

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O0

int32_t __thiscall icu_63::UVector32::indexOf(UVector32 *this,int32_t key,int32_t startIndex)

{
  int local_24;
  int32_t i;
  int32_t startIndex_local;
  int32_t key_local;
  UVector32 *this_local;
  
  local_24 = startIndex;
  while( true ) {
    if (this->count <= local_24) {
      return -1;
    }
    if (key == this->elements[local_24]) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int32_t UVector32::indexOf(int32_t key, int32_t startIndex) const {
    int32_t i;
    for (i=startIndex; i<count; ++i) {
        if (key == elements[i]) {
            return i;
        }
    }
    return -1;
}